

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SonarAltitudeEstimation.cpp
# Opt level: O2

void * SonarAltitudeEstimationThread(void *pParam)

{
  size_type sVar1;
  reference pdVar2;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var3;
  long __n;
  vector<double,_std::allocator<double>_> Vdistances_filtered;
  vector<double,_std::allocator<double>_> Valpha_filtered;
  double alpha_mes_robot;
  CHRONO chrono;
  _Vector_base<double,_std::allocator<double>_> local_b8;
  _Vector_base<double,_std::allocator<double>_> local_98;
  double local_80;
  CHRONO local_78;
  
  local_98._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_98._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_start = (double *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (double *)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dmin_sonaraltitudeestimation = robheight * 0.5 + d_max_err;
  StartChrono(&local_78);
  do {
    do {
      uSleep(100000);
      if (bExit != 0) goto LAB_00164327;
    } while (bSonarAltitudeEstimation == 0);
    pthread_mutex_lock((pthread_mutex_t *)&SonarAltitudeEstimationCS);
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    if (local_98._M_impl.super__Vector_impl_data._M_finish !=
        local_98._M_impl.super__Vector_impl_data._M_start) {
      local_98._M_impl.super__Vector_impl_data._M_finish =
           local_98._M_impl.super__Vector_impl_data._M_start;
    }
    if (local_b8._M_impl.super__Vector_impl_data._M_finish !=
        local_b8._M_impl.super__Vector_impl_data._M_start) {
      local_b8._M_impl.super__Vector_impl_data._M_finish =
           local_b8._M_impl.super__Vector_impl_data._M_start;
    }
    __n = 0;
    while( true ) {
      sVar1 = std::deque<double,_std::allocator<double>_>::size(&alpha_mes_vector);
      if ((int)sVar1 <= __n) break;
      pdVar2 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                         (&alpha_mes_vector.super__Deque_base<double,_std::allocator<double>_>.
                           _M_impl.super__Deque_impl_data._M_start,__n);
      local_80 = *pdVar2;
      pdVar2 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                         (&d_mes_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
                           super__Deque_impl_data._M_start,__n);
      if (dmin_sonaraltitudeestimation <= *pdVar2) {
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)&local_98,&local_80);
        pdVar2 = std::_Deque_iterator<double,_double_&,_double_*>::operator[]
                           (&d_mes_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl
                             .super__Deque_impl_data._M_start,__n);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)&local_b8,pdVar2);
      }
      __n = __n + 1;
    }
    _Var3 = std::
            __min_element<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__ops::_Iter_less_iter>
                      (local_b8._M_impl.super__Vector_impl_data._M_start,
                       local_b8._M_impl.super__Vector_impl_data._M_finish);
    if ((_Var3._M_current != local_b8._M_impl.super__Vector_impl_data._M_finish) &&
       (*_Var3._M_current < (double)rangescale)) {
      altitude_AGL = *_Var3._M_current * 0.3420201433256687;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    pthread_mutex_unlock((pthread_mutex_t *)&SonarAltitudeEstimationCS);
  } while (bExit == 0);
LAB_00164327:
  StopChronoQuick(&local_78);
  if (bExit == 0) {
    bExit = 1;
  }
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_b8);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SonarAltitudeEstimationThread(void* pParam)
{
	UNREFERENCED_PARAMETER(pParam);

	vector<double> Valpha_filtered; 
	vector<double> Vdistances_filtered;
	int i = 0;

	CHRONO chrono;

	// Missing error checking...

	dmin_sonaraltitudeestimation = d_max_err+0.5*robheight;

	StartChrono(&chrono);

	for (;;)
	{
		uSleep(1000*100);

		if (bExit) break;
		if (!bSonarAltitudeEstimation) continue;

		EnterCriticalSection(&SonarAltitudeEstimationCS);

		EnterCriticalSection(&StateVariablesCS);

		// Computations are in the robot coordinate system...

		Valpha_filtered.clear();
		Vdistances_filtered.clear();
		for (i = 0; i < (int)alpha_mes_vector.size(); i++)
		{
			double alpha_mes_robot = alpha_mes_vector[i];
			// Filter the distances that are too close or too far away.
			//if ((d_mes_vector[i] >= dmin_sonaraltitudeestimation)&&(d_mes_vector[i] <= rangescale))
			if (d_mes_vector[i] >= dmin_sonaraltitudeestimation)
			{
				Valpha_filtered.push_back(alpha_mes_robot);
				Vdistances_filtered.push_back(d_mes_vector[i]);
			}
		}

		// Temp...

		// Sonar VerticalBeam = 40 deg should be in global...

		std::vector<double>::iterator it = std::min_element(Vdistances_filtered.begin(), Vdistances_filtered.end());
		if ((it != Vdistances_filtered.end())&&((*it) < rangescale)) altitude_AGL = (*it)*sin(0.5*40.0*M_PI/180.0);
		
		LeaveCriticalSection(&StateVariablesCS);

		LeaveCriticalSection(&SonarAltitudeEstimationCS);

		if (bExit) break;
	}

	StopChronoQuick(&chrono);

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}